

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<NodeList<Node>_> * __thiscall
vector<NodeList<Node>_>::operator=(vector<NodeList<Node>_> *this,vector<NodeList<Node>_> *other)

{
  int iVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  undefined8 *puVar7;
  vector<Node> *pvVar8;
  NodeList<Node> *this_00;
  ulong uVar9;
  
  iVar1 = other->_size;
  this->_size = iVar1;
  uVar9 = (ulong)other->_capacity;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  uVar4 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar5 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  this->_capacity = other->_capacity;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x18),8) == 0) {
    uVar4 = uVar5;
  }
  puVar6 = (ulong *)operator_new__(uVar4);
  *puVar6 = uVar9;
  if (uVar9 != 0) {
    uVar4 = uVar9 * 0x18;
    uVar9 = 0;
    do {
      puVar7 = (undefined8 *)operator_new__(8);
      *puVar7 = 0;
      *(undefined8 **)((long)puVar6 + uVar9 + 8) = puVar7;
      *(undefined8 *)((long)puVar6 + uVar9 + 0x10) = 0x100000000;
      *(undefined4 *)((long)puVar6 + uVar9 + 0x18) = 0;
      uVar9 = uVar9 + 0x18;
    } while (uVar4 != uVar9);
  }
  this_00 = (NodeList<Node> *)(puVar6 + 1);
  this->vect = this_00;
  if (0 < iVar1) {
    pvVar8 = vector<Node>::operator=((vector<Node> *)this_00,&other->vect->nodes);
    for (; uVar9 != 0; uVar9 = uVar9 - 0x18) {
      pvVar2 = *(void **)((long)puVar6 + (uVar9 - 8));
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
    }
    operator_delete__(this_00);
    _Unwind_Resume(pvVar8);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }